

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void GdlRule::DebugEngineCode
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *vb,uint32_t param_2,
               ostream *strmOut)

{
  byte bVar1;
  byte bVar2;
  uchar uVar3;
  uchar uVar4;
  ushort uVar5;
  pointer puVar6;
  ostream *poVar7;
  int slat;
  int slat_00;
  int gmet;
  int slat_01;
  int pstat;
  int slat_02;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  int op;
  long lVar13;
  string local_50;
  
  op = 0;
  do {
    puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (*(int *)&(vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (int)puVar6 <= op) {
      return;
    }
    lVar13 = (long)op;
    uVar10 = (uint)puVar6[lVar13];
    EngineCodeDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)uVar10,op);
    std::operator<<(strmOut,(string *)&local_50);
    uVar11 = lVar13 + 1;
    std::__cxx11::string::~string((string *)&local_50);
    iVar12 = 0;
    uVar8 = 1;
    iVar9 = (int)uVar11;
    switch(uVar10) {
    case 1:
    case 0x1a:
    case 0x1e:
    case 0x42:
      goto switchD_00110256_caseD_1;
    case 2:
    case 0x1c:
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      goto LAB_001104bd;
    case 3:
    case 0x3b:
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = op + 3;
      uVar8 = (int)(short)((ushort)puVar6[uVar11] << 8) | (uint)puVar6[lVar13 + 2];
      goto LAB_001107bf;
    case 4:
      uVar10 = op + 3;
      poVar7 = std::operator<<(strmOut," ");
      goto LAB_00110765;
    case 5:
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = op + 5;
      uVar8 = (uint)puVar6[lVar13 + 4] |
              ((uint)puVar6[lVar13 + 3] |
              (uint)puVar6[lVar13 + 2] << 8 | (uint)puVar6[uVar11] << 0x10) << 8;
      goto LAB_001107bf;
    default:
      uVar8 = 0;
      goto switchD_00110256_caseD_1;
    case 0x1d:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)bVar1);
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      uVar10 = op + 4;
      poVar7 = std::operator<<(strmOut," ");
LAB_00110765:
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      goto LAB_001107ce;
    case 0x21:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      uVar8 = (uint)bVar1;
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)bVar1);
      break;
    case 0x22:
    case 0x2b:
      uVar8 = 2;
switchD_00110256_caseD_1:
      goto LAB_001107d9;
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      SlotAttributeDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,slat);
      std::operator<<(poVar7,(string *)&local_50);
      goto LAB_001104aa;
    case 0x27:
    case 0x33:
    case 0x34:
    case 0x35:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      SlotAttributeDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,slat_00);
      std::operator<<(poVar7,(string *)&local_50);
      goto LAB_0011056d;
    case 0x28:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      SlotAttributeDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,slat_02);
      std::operator<<(poVar7,(string *)&local_50);
LAB_0011056d:
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case 0x29:
    case 0x2c:
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      break;
    case 0x2a:
    case 0x2d:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      GlyphMetricDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,gmet);
      std::operator<<(poVar7,(string *)&local_50);
      goto LAB_00110424;
    case 0x2e:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      SlotAttributeDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,slat_01);
      std::operator<<(poVar7,(string *)&local_50);
LAB_00110424:
      std::__cxx11::string::~string((string *)&local_50);
      uVar8 = 2;
      break;
    case 0x36:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      ProcessStateDebugString_abi_cxx11_(&local_50,(GdlRule *)(ulong)bVar1,pstat);
      std::operator<<(poVar7,(string *)&local_50);
LAB_001104aa:
      std::__cxx11::string::~string((string *)&local_50);
LAB_001104bd:
      uVar8 = 0;
      break;
    case 0x38:
      goto LAB_00110668;
    case 0x39:
      goto LAB_0011060d;
    case 0x3a:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar11];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)bVar1);
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar6[lVar13 + 2];
      iVar9 = op + 4;
      bVar2 = puVar6[lVar13 + 3];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(short)((ushort)bVar1 << 8) | (uint)bVar2);
LAB_0011060d:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar9];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)bVar1);
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar6[(long)iVar9 + 1];
      bVar2 = puVar6[(long)iVar9 + 2];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(short)((ushort)bVar1 << 8) | (uint)bVar2);
      iVar9 = iVar9 + 3;
LAB_00110668:
      bVar1 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[iVar9];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)bVar1);
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar6[(long)iVar9 + 1];
      bVar2 = puVar6[(long)iVar9 + 2];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(short)((ushort)bVar1 << 8) | (uint)bVar2);
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar6[(long)iVar9 + 3];
      uVar11 = (ulong)(iVar9 + 5);
      bVar2 = puVar6[(long)iVar9 + 4];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(short)((ushort)bVar1 << 8) | (uint)bVar2);
      uVar8 = 0;
      goto LAB_001107d9;
    case 0x3c:
    case 0x3d:
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar1 = puVar6[uVar11];
      bVar2 = puVar6[lVar13 + 2];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(short)((ushort)bVar1 << 8) | (uint)bVar2);
      uVar11 = (ulong)(op + 3);
      goto LAB_001107d9;
    case 0x41:
      puVar6 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar4 = puVar6[uVar11];
      uVar3 = puVar6[lVar13 + 2];
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(uint)CONCAT11(uVar4,uVar3));
      uVar10 = op + 5;
      uVar5 = *(ushort *)
               ((vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start + lVar13 + 3);
      uVar8 = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
LAB_001107bf:
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,uVar8);
LAB_001107ce:
      uVar11 = (ulong)uVar10;
      uVar8 = 0;
      goto LAB_001107d9;
    }
    uVar11 = (ulong)(op + 2);
LAB_001107d9:
    lVar13 = (long)(int)uVar11;
    for (; -uVar8 != iVar12; iVar12 = iVar12 + -1) {
      uVar4 = (vb->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      lVar13 = lVar13 + 1;
      poVar7 = std::operator<<(strmOut," ");
      std::ostream::operator<<(poVar7,(int)(char)uVar4);
    }
    op = (int)uVar11 - iVar12;
    std::operator<<(strmOut,"\n");
  } while( true );
}

Assistant:

void GdlRule::DebugEngineCode(std::vector<gr::byte> & vb, uint32_t /*fxdRuleVersion*/, std::ostream & strmOut)
{
	int ib = 0;
	while (ib < signed(vb.size()))
	{
		int op = vb[ib++];
		strmOut << EngineCodeDebugString(op);

		int cbArgs = 0;
		int slat;
		unsigned int nUnsigned;
		int nSigned;
		signed short int nSignedShort;
		int gmet;
		int pstat;
		switch (op)
		{
		case kopNop:				cbArgs = 0;		break;
		case kopPushByte:			cbArgs = 1;		break;
		case kopPushByteU:
			nUnsigned = (unsigned int)vb[ib++];
			strmOut << " " << nUnsigned;
			break;
		case kopPushShort:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;
			break;
		case kopPushShortU:
			nUnsigned = (unsigned int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			strmOut << " " << nUnsigned;
			break;
		case kopPushLong:
			nUnsigned = (int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			break;
		case kopAdd:				cbArgs = 0;		break;
		case kopSub:				cbArgs = 0;		break;
		case kopMul:				cbArgs = 0;		break;
		case kopDiv:				cbArgs = 0;		break;
		case kopBitAnd:				cbArgs = 0;		break;
		case kopBitOr:				cbArgs = 0;		break;
		case kopBitNot:				cbArgs = 0;		break;
		case kopMin:				cbArgs = 0;		break;
		case kopMax:				cbArgs = 0;		break;
		case kopNeg:				cbArgs = 0;		break;
		case kopTrunc8:				cbArgs = 0;		break;
		case kopTrunc16:			cbArgs = 0;		break;
		case kopCond:				cbArgs = 0;		break;
		case kopAnd:				cbArgs = 0;		break;
		case kopOr:					cbArgs = 0;		break;
		case kopNot:				cbArgs = 0;		break;
		case kopEqual:				cbArgs = 0;		break;
		case kopNotEq:				cbArgs = 0;		break;
		case kopLess:				cbArgs = 0;		break;
		case kopGtr:				cbArgs = 0;		break;
		case kopLessEq:				cbArgs = 0;		break;
		case kopGtrEq:				cbArgs = 0;		break;
		case kopNext:				cbArgs = 0;		break;
		case kopNextN:				cbArgs = 1;		break;	// N
		case kopCopyNext:			cbArgs = 0;		break;
		case kopPutGlyphV1_2:
			nUnsigned = (unsigned int)vb[ib++];	// output class
			strmOut << " " << nUnsigned;
			cbArgs = 0;
			break;
		case kopPutSubsV1_2:
			nSigned = (signed int)vb[ib++];		// selector
			strmOut << " " << nSigned;
			nUnsigned = (unsigned int)vb[ib++];	// input class
			strmOut << " " << nUnsigned;
			nUnsigned = (unsigned int)vb[ib++];	// output class
			strmOut << " " << nUnsigned;
			cbArgs = 0;
			break;
		case kopPutCopy:			cbArgs = 1;		break;	// selector
		case kopInsert:				cbArgs = 0;		break;
		case kopDelete:				cbArgs = 0;		break;

		case kopPutGlyph:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// output class
			break;

		case kopPutSubs3:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			// fall through
		case kopPutSubs2:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			// fall through
		case kopPutSubs:
			nSigned = (int)vb[ib++];
			strmOut << " " << nSigned;	// slot offset
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// input class
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// output class
			break;

		case kopAssoc:
			cbArgs = vb[ib++];
			strmOut << " " << cbArgs;
			break;
		case kopCntxtItem:			cbArgs = 2;		break;

		case kopAttrSet:
		case kopAttrAdd:
		case kopAttrSub:
//		case kopAttrBitAnd:
//		case kopAttrBitOr:
		case kopAttrSetSlot:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 0;
			break;
		case kopIAttrSet:
		case kopIAttrAdd:
		case kopIAttrSub:
//		case kopIAttrBitAnd:
//		case kopIAttrBitOr:
		case kopIAttrSetSlot:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 1;
			break;
		case kopPushSlotAttr:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 1;	// selector
			break;
		case kopPushISlotAttr:
			slat = vb[ib++];
			strmOut << " " << SlotAttributeDebugString(slat);
			cbArgs = 2;	// selector, index
			break;
		case kopPushGlyphAttr:
		case kopPushAttToGlyphAttr:
			nSignedShort = (signed short int)vb[ib++];
			nSignedShort = (nSignedShort << 8) + vb[ib++];
			nSigned = (signed int)nSignedShort;
			strmOut << " " << nSigned;	// glyph attribute
			cbArgs = 1;					// selector
			break;
		case kopPushGlyphAttrV1_2:
		case kopPushAttToGAttrV1_2:
			nUnsigned = (unsigned int)vb[ib++]; // glyph attribute
			strmOut << " " << nUnsigned;
			cbArgs = 1;							// selector
			break;
		case kopPushGlyphMetric:
		case kopPushAttToGlyphMetric:
			gmet = vb[ib++];
			strmOut << " " << GlyphMetricDebugString(gmet);
			cbArgs = 2;	// selector, cluster
			break;
		case kopPushFeat:			cbArgs = 2;		break;	// feature internal ID, selector
		//case kopPushIGlyphAttr:	cbArgs = 2;		break;	// glyph attr, index
		case kopPushProcState:
			pstat = vb[ib++];
			strmOut << " " << ProcessStateDebugString(pstat);
			cbArgs = 0;
			break;
		case kopPushVersion:		cbArgs = 0;		break;
		case kopPopRet:				cbArgs = 0;		break;
		case kopRetZero:			cbArgs = 0;		break;
		case kopRetTrue:			cbArgs = 0;		break;
		case kopSetBits:
			nUnsigned = (signed short int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			nUnsigned = (signed short int)vb[ib++];
			nUnsigned = (nUnsigned << 8) + vb[ib++];
			nSigned = (signed int)nUnsigned;
			strmOut << " " << nSigned;
			cbArgs = 0;
			break;

		case kopFeatSet:			cbArgs = 1;		break;	// feature internal ID

		default:
			Assert(false);
			cbArgs = 0;
		}

		// This loop handles only 8-bit signed values.
		for (int iTmp = 0; iTmp < cbArgs; iTmp++)
		{
			int n = (char)vb[ib++];
			strmOut << " " << n;
		}
		strmOut << "\n";
	}
}